

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  WhereLoop **ppWVar7;
  SrcList *pSVar8;
  byte bVar9;
  i8 iVar10;
  LogEst LVar11;
  LogEst LVar12;
  short sVar13;
  uint uVar14;
  int extraout_EAX;
  WherePath *pWVar15;
  undefined6 extraout_var;
  LogEst *pLVar16;
  int iVar17;
  uint uVar18;
  WhereLoop ***pppWVar19;
  LogEst *pLVar20;
  WherePath *pPath;
  uint uVar21;
  WherePath *pWVar22;
  undefined4 uVar23;
  undefined6 in_register_00000032;
  WhereLoop **ppWVar24;
  ExprList *pOrderBy;
  ulong uVar25;
  sqlite3 *db;
  int iVar26;
  ushort *puVar27;
  WhereLoop *pWVar28;
  short sVar29;
  ulong uVar30;
  Bitmask revMask;
  uint local_e8;
  Bitmask local_d8;
  int local_d0;
  uint local_cc;
  WherePath *local_c8;
  int local_bc;
  sqlite3 *local_b8;
  undefined8 local_b0;
  WhereLoop **local_a8;
  LogEst *local_a0;
  WhereInfo *local_98;
  ulong local_90;
  Parse *local_88;
  ulong local_80;
  ulong local_78;
  undefined4 local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  WherePath *local_58;
  ushort *local_50;
  ulong local_48;
  LogEst *local_40;
  size_t local_38;
  
  local_b0 = CONCAT62(in_register_00000032,nRowEst);
  local_88 = pWInfo->pParse;
  local_b8 = local_88->db;
  bVar9 = pWInfo->nLevel;
  puVar27 = (ushort *)(ulong)bVar9;
  uVar30 = 1;
  if (1 < bVar9) {
    uVar30 = (ulong)((uint)(bVar9 != 2) * 5 + 5);
  }
  iVar26 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    iVar26 = pWInfo->pOrderBy->nExpr;
  }
  iVar17 = (int)uVar30 * 2;
  local_58 = (WherePath *)
             sqlite3DbMallocRawNN
                       (local_b8,(long)(int)(((uint)bVar9 * 8 + 0x20) * iVar17 +
                                            (int)((long)iVar26 * 2)));
  if (local_58 == (WherePath *)0x0) {
    return 0;
  }
  uVar25 = (ulong)(uint)((int)uVar30 << 5);
  pPath = (WherePath *)((long)&local_58->maskLoop + uVar25);
  puVar1 = (undefined8 *)((long)&local_58->nRow + uVar25);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_58->maskLoop + uVar25);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_a8 = (WhereLoop **)((long)&pPath->maskLoop + uVar25);
  uVar21 = iVar17 + 1;
  pppWVar19 = &local_58->aLoop;
  do {
    *pppWVar19 = local_a8;
    uVar21 = uVar21 - 1;
    local_a8 = (WhereLoop **)((long)local_a8 + (ulong)((uint)bVar9 * 8));
    pppWVar19 = pppWVar19 + 4;
  } while (1 < uVar21);
  local_d0 = iVar26;
  local_90 = uVar30;
  if (iVar26 == 0) {
    uVar21 = local_88->nQueryLoop;
    pLVar20 = (LogEst *)(ulong)uVar21;
    uVar14 = 0x30;
    if (uVar21 < 0x30) {
      uVar14 = uVar21;
    }
    LVar11 = (LogEst)uVar14;
    local_a8 = (WhereLoop **)0x0;
  }
  else {
    memset(local_a8,0,(long)iVar26 * 2);
    uVar21 = 0x30;
    if (local_88->nQueryLoop < 0x30) {
      uVar21 = local_88->nQueryLoop;
    }
    LVar11 = (LogEst)uVar21;
    pLVar20 = (LogEst *)-(long)puVar27;
    pPath->isOrdered = -(puVar27 != (ushort *)0x0) | (byte)iVar26;
  }
  pPath->nRow = LVar11;
  if (puVar27 != (ushort *)0x0) {
    local_64 = 2;
    if (2 < (uint)local_90) {
      local_64 = (uint)local_90;
    }
    local_68 = (int)local_b0 + -0x32;
    iVar26 = 1;
    local_a0 = (LogEst *)0x0;
    local_e8 = 0;
    uVar25 = 0;
    uVar30 = 0;
    pWVar15 = local_58;
    local_98 = pWInfo;
    local_50 = puVar27;
    do {
      local_c8 = pWVar15;
      if (iVar26 < 1) {
        pLVar16 = (LogEst *)0x0;
      }
      else {
        local_38 = (long)local_a0 * 8;
        local_40 = &pWVar15[1].rUnsorted;
        local_bc = 0;
        local_60 = (uint)local_a0 & 0xffff;
        pLVar16 = (LogEst *)0x0;
        pLVar20 = local_a0;
        pWVar15 = pPath;
        local_5c = iVar26;
        do {
          for (pWVar28 = pWInfo->pLoops; pWVar28 != (WhereLoop *)0x0; pWVar28 = pWVar28->pNextLoop)
          {
            bVar9 = pWVar15->isOrdered;
            local_d8 = 0;
            uVar5 = pWVar15->maskLoop;
            if ((((pWVar28->prereq & ~uVar5) == 0) &&
                (uVar6 = pWVar28->maskSelf, (uVar6 & uVar5) == 0)) &&
               ((sVar29 = pWVar15->nRow, (pWVar28->wsFlags & 0x4000) == 0 || (2 < sVar29)))) {
              local_cc = (uint)pLVar16;
              local_80 = uVar25;
              local_78 = uVar30;
              LVar11 = sqlite3LogEstAdd(pWVar28->rSetup,pWVar28->rRun + sVar29);
              LVar11 = sqlite3LogEstAdd(LVar11,pWVar15->rUnsorted);
              sVar29 = sVar29 + pWVar28->nOut;
              if ((char)bVar9 < '\0') {
                bVar9 = wherePathSatisfiesOrderBy
                                  (local_98,local_98->pOrderBy,pWVar15,local_98->wctrlFlags,
                                   (u16)local_60,pWVar28,&local_d8);
              }
              else {
                local_d8 = pWVar15->revLoop;
              }
              iVar17 = local_d0 - (char)bVar9;
              iVar26 = (int)local_90;
              if ((iVar17 == 0 || local_d0 < (char)bVar9) || (char)bVar9 < '\0') {
                LVar12 = LVar11 + -2;
                sVar13 = LVar11;
              }
              else {
                sVar13 = *(short *)((long)local_a8 + (ulong)bVar9 * 2);
                if (sVar13 == 0) {
                  local_48 = (ulong)bVar9;
                  LVar12 = sqlite3LogEst((long)((iVar17 * 100) / local_d0));
                  uVar23 = (undefined4)CONCAT62(extraout_var,LVar12);
                  uVar21 = (uint)local_b0;
                  if (((local_98->wctrlFlags & 0x4000) != 0) &&
                     (uVar21 = *(uint *)&local_98->iLimit,
                     (short)local_b0 <= (short)*(uint *)&local_98->iLimit)) {
                    uVar21 = (uint)local_b0;
                  }
                  if ((short)uVar21 < 0xb) {
                    sVar13 = 0;
                  }
                  else {
                    local_6c = uVar23;
                    LVar12 = sqlite3LogEst((ulong)(uVar21 & 0xffff));
                    sVar13 = LVar12 + -0x21;
                    uVar23 = local_6c;
                  }
                  sVar13 = sVar13 + (short)local_68 + (short)uVar23;
                  *(short *)((long)local_a8 + local_48 * 2) = sVar13;
                }
                LVar12 = sqlite3LogEstAdd(LVar11,sVar13);
                iVar26 = (int)local_90;
                sVar13 = LVar12 + 5;
                LVar12 = LVar11;
              }
              pLVar16 = (LogEst *)(ulong)local_cc;
              uVar30 = local_78;
              uVar25 = local_80;
              if (0 < (int)local_cc) {
                pLVar20 = pLVar16;
                pWVar22 = local_c8;
                do {
                  if ((pWVar22->maskLoop == (uVar6 | uVar5)) &&
                     (-1 < (char)(pWVar22->isOrdered ^ bVar9))) {
                    if ((pWVar22->rCost < sVar13) ||
                       ((pWVar22->rCost == sVar13 &&
                        ((pWVar22->nRow < sVar29 ||
                         ((pWVar22->nRow == sVar29 && (pWVar22->rUnsorted <= LVar12))))))))
                    goto LAB_00179cd9;
                    goto LAB_00179bcf;
                  }
                  pWVar22 = pWVar22 + 1;
                  uVar21 = (int)pLVar20 - 1;
                  pLVar20 = (LogEst *)(ulong)uVar21;
                } while (uVar21 != 0);
              }
              uVar21 = local_cc;
              if (((int)local_cc < iVar26) ||
                 ((pLVar20 = pLVar16, sVar13 <= (short)local_80 &&
                  ((uVar21 = local_e8, sVar13 != (short)local_80 ||
                   (pLVar20 = (LogEst *)(ulong)local_e8, LVar12 < (short)local_78)))))) {
                pLVar16 = (LogEst *)(ulong)(local_cc + ((int)local_cc < iVar26));
                pWVar22 = local_c8 + (int)uVar21;
LAB_00179bcf:
                pWVar22->maskLoop = pWVar28->maskSelf | pWVar15->maskLoop;
                pWVar22->revLoop = local_d8;
                pWVar22->nRow = sVar29;
                pWVar22->rCost = sVar13;
                pWVar22->rUnsorted = LVar12;
                pWVar22->isOrdered = bVar9;
                memcpy(pWVar22->aLoop,pWVar15->aLoop,local_38);
                pWVar22->aLoop[(long)local_a0] = pWVar28;
                pLVar20 = local_a0;
                uVar30 = local_78;
                uVar25 = local_80;
                if ((int)local_90 <= (int)pLVar16) {
                  local_e8 = 0;
                  uVar30 = (ulong)(ushort)local_c8->nRow;
                  uVar25 = (ulong)(ushort)local_c8->rCost;
                  if (1 < (byte)local_50) {
                    local_e8 = 0;
                    uVar21 = 1;
                    pLVar20 = local_40;
                    do {
                      uVar3 = pLVar20[-1];
                      if ((short)(ushort)uVar25 < (short)uVar3) {
                        uVar4 = *pLVar20;
LAB_00179ca9:
                        uVar30 = (ulong)uVar4;
                        uVar25 = (ulong)uVar3;
                        local_e8 = uVar21;
                      }
                      else if ((uVar3 == (ushort)uVar25) &&
                              (uVar4 = *pLVar20, (short)uVar30 < (short)uVar4)) goto LAB_00179ca9;
                      uVar21 = uVar21 + 1;
                      pLVar20 = pLVar20 + 0x10;
                    } while (local_64 != uVar21);
                  }
                }
              }
            }
LAB_00179cd9:
          }
          local_bc = local_bc + 1;
          pWVar15 = pWVar15 + 1;
          pWInfo = local_98;
        } while (local_bc != local_5c);
      }
      local_a0 = (LogEst *)((long)local_a0 + 1);
      iVar26 = (int)pLVar16;
      pWVar15 = pPath;
      pPath = local_c8;
    } while ((ushort *)local_a0 != local_50);
    if (iVar26 == 0) {
      sqlite3ErrorMsg(local_88,"no query solution",local_c8,pLVar20);
      db = local_b8;
      goto LAB_00179f11;
    }
    if (1 < iVar26) {
      pLVar16 = (LogEst *)((long)pLVar16 + -1);
      pWVar15 = local_c8;
      do {
        pWVar22 = pWVar15 + 1;
        if (pPath->rCost <= pWVar15[1].rCost) {
          pWVar22 = pPath;
        }
        pPath = pWVar22;
        pLVar16 = (LogEst *)((long)pLVar16 + -1);
        pWVar15 = pWVar15 + 1;
      } while (pLVar16 != (LogEst *)0x0);
    }
    puVar27 = local_50;
    if (local_50 != (ushort *)0x0) {
      ppWVar7 = pPath->aLoop;
      pSVar8 = pWInfo->pTabList;
      ppWVar24 = &pWInfo->a[0].pWLoop;
      uVar30 = 0;
      do {
        pWVar28 = ppWVar7[uVar30];
        *ppWVar24 = pWVar28;
        bVar9 = pWVar28->iTab;
        *(byte *)((long)ppWVar24 + -0x1c) = bVar9;
        *(int *)((long)ppWVar24 + -0x44) = pSVar8->a[bVar9].iCursor;
        uVar30 = uVar30 + 1;
        ppWVar24 = ppWVar24 + 0xb;
      } while (((ulong)local_50 & 0xffffffff) != uVar30);
    }
  }
  db = local_b8;
  if (((((pWInfo->wctrlFlags & 0x180) == 0x100) && ((short)local_b0 != 0)) &&
      (pWInfo->eDistinct == '\0')) &&
     (iVar10 = wherePathSatisfiesOrderBy
                         (pWInfo,pWInfo->pResultSet,pPath,0x80,(short)puVar27 - 1,
                          pPath->aLoop[(long)puVar27 + -1],&local_d8),
     pWInfo->pResultSet->nExpr == (int)iVar10)) {
    pWInfo->eDistinct = '\x02';
  }
  pWInfo->bOrderedInnerLoop = '\0';
  pOrderBy = pWInfo->pOrderBy;
  if (pOrderBy != (ExprList *)0x0) {
    uVar21 = (uint)pWInfo->wctrlFlags;
    cVar2 = pPath->isOrdered;
    if ((char)pWInfo->wctrlFlags < '\0') {
      if (pOrderBy->nExpr == (int)cVar2) {
        pWInfo->eDistinct = '\x02';
      }
    }
    else {
      pWInfo->nOBSat = cVar2;
      pWInfo->revMask = pPath->revLoop;
      if ((cVar2 < '\x01') && (pWInfo->nOBSat = '\0', puVar27 != (ushort *)0x0)) {
        uVar18 = (int)puVar27 - 1;
        uVar14 = pPath->aLoop[uVar18]->wsFlags;
        if ((~uVar14 & 0x104) != 0 && (uVar14 >> 0xc & 1) == 0) {
          local_d8 = 0;
          iVar10 = wherePathSatisfiesOrderBy
                             (pWInfo,pOrderBy,pPath,0x800,(u16)uVar18,pPath->aLoop[uVar18],&local_d8
                             );
          pOrderBy = pWInfo->pOrderBy;
          if (pOrderBy->nExpr == (int)iVar10) {
            pWInfo->bOrderedInnerLoop = '\x01';
            pWInfo->revMask = local_d8;
          }
          uVar21 = (uint)pWInfo->wctrlFlags;
        }
      }
    }
    if ((((uVar21 >> 9 & 1) != 0) && (puVar27 != (ushort *)0x0)) &&
       (pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
      local_d8 = 0;
      uVar21 = (int)puVar27 - 1;
      iVar10 = wherePathSatisfiesOrderBy
                         (pWInfo,pOrderBy,pPath,0,(u16)uVar21,pPath->aLoop[uVar21],&local_d8);
      if (pWInfo->pOrderBy->nExpr == (int)iVar10) {
        pWInfo->sorted = '\x01';
        pWInfo->revMask = local_d8;
      }
    }
  }
  pWInfo->nRowOut = pPath->nRow;
LAB_00179f11:
  sqlite3DbFreeNN(db,local_58);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  sqlite3 *db;              /* The database connection */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  db = pParse->db;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3DbMallocRawNN(db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array 
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered, 
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered = pFrom->isOrdered;  /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask = 0;              /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop. 
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        if( isOrdered<0 ){
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy, 
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          ** 
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost 
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost 
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted) 
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3DbFreeNN(db, pSpace);
    return SQLITE_ERROR;
  }
  
  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->nOBSat = pFrom->isOrdered;
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0 
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, 
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3DbFreeNN(db, pSpace);
  return SQLITE_OK;
}